

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_write_data(mtar_t *tar,void *data,size_t size)

{
  size_t sVar1;
  int err;
  size_t size_local;
  void *data_local;
  mtar_t *tar_local;
  
  tar_local._4_4_ = mtar_twrite(tar,data,size);
  if (tar_local._4_4_ == 0) {
    tar->remaining_data = tar->remaining_data - size;
    if (tar->remaining_data == 0) {
      sVar1 = mtar_round_up(tar->pos,0x200);
      tar_local._4_4_ = mtar_write_null_bytes(tar,sVar1 - tar->pos);
    }
    else {
      tar_local._4_4_ = 0;
    }
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_write_data(mtar_t *tar, const void *data, size_t size) {
  int err;
  /* Write data */
  err = mtar_twrite(tar, data, size);
  if (err) {
    return err;
  }
  tar->remaining_data -= size;
  /* Write padding if we've written all the data for this file */
  if (tar->remaining_data == 0) {
    return mtar_write_null_bytes(tar, mtar_round_up(tar->pos, 512) - tar->pos);
  }
  return MTAR_ESUCCESS;
}